

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sscClass.c
# Opt level: O2

void Ssc_GiaClassesCheckPairs(Gia_Man_t *p,Vec_Int_t *vDisPairs)

{
  uint uVar1;
  uint uVar2;
  int i;
  
  for (i = 1; i < vDisPairs->nSize; i = i + 2) {
    uVar1 = Vec_IntEntry(vDisPairs,i + -1);
    uVar2 = Vec_IntEntry(vDisPairs,i);
    if (uVar1 == ((uint)p->pReprs[(int)uVar2] & 0xfffffff)) {
      printf("Pair (%d, %d) are still equivalent.\n",(ulong)uVar1,(ulong)uVar2);
    }
  }
  return;
}

Assistant:

void Ssc_GiaClassesCheckPairs( Gia_Man_t * p, Vec_Int_t * vDisPairs )
{
    int i, iRepr, iObj, Result = 1;
    Vec_IntForEachEntryDouble( vDisPairs, iRepr, iObj, i )
        if ( iRepr == Gia_ObjRepr(p, iObj) )
            printf( "Pair (%d, %d) are still equivalent.\n", iRepr, iObj ), Result = 0;
//    if ( Result )
//        printf( "Classes are refined correctly.\n" );
}